

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_number(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  uint uVar2;
  bool bVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  ulong local_88;
  size_t i;
  uchar local_78 [7];
  uchar decimal_point;
  uchar number_c_string [64];
  uchar *local_30;
  uchar *after_end;
  double number;
  parse_buffer *input_buffer_local;
  cJSON *item_local;
  
  after_end = (uchar *)0x0;
  local_30 = (uchar *)0x0;
  number = (double)input_buffer;
  input_buffer_local = (parse_buffer *)item;
  uVar1 = get_decimal_point();
  if ((number == 0.0) || (*(long *)number == 0)) {
    item_local._4_4_ = 0;
  }
  else {
    local_88 = 0;
    while( true ) {
      bVar3 = false;
      if ((local_88 < 0x3f) && (bVar3 = false, number != 0.0)) {
        bVar3 = *(long *)((long)number + 0x10) + local_88 < *(ulong *)((long)number + 8);
      }
      if (!bVar3) break;
      uVar2 = (uint)*(byte *)(local_88 + *(long *)number + *(long *)((long)number + 0x10));
      if ((uVar2 == 0x2b) || (uVar2 == 0x2d)) {
LAB_00109c75:
        local_78[local_88] = *(uchar *)(*(long *)number + *(long *)((long)number + 0x10) + local_88)
        ;
      }
      else {
        if (uVar2 != 0x2e) {
          if (((uVar2 - 0x30 < 10) || (uVar2 == 0x45)) || (uVar2 == 0x65)) goto LAB_00109c75;
          break;
        }
        local_78[local_88] = uVar1;
      }
      local_88 = local_88 + 1;
    }
    local_78[local_88] = '\0';
    p_Var4 = (_func_void_ptr_void_ptr_size_t *)strtod((char *)local_78,(char **)&local_30);
    if (local_78 == local_30) {
      item_local._4_4_ = 0;
    }
    else {
      (input_buffer_local->hooks).reallocate = p_Var4;
      if ((double)p_Var4 < 2147483647.0) {
        if (-2147483648.0 < (double)p_Var4) {
          *(int *)&(input_buffer_local->hooks).deallocate = (int)(double)p_Var4;
        }
        else {
          *(undefined4 *)&(input_buffer_local->hooks).deallocate = 0x80000000;
        }
      }
      else {
        *(undefined4 *)&(input_buffer_local->hooks).deallocate = 0x7fffffff;
      }
      *(undefined4 *)&input_buffer_local->depth = 8;
      *(uchar **)((long)number + 0x10) =
           local_30 + (*(long *)((long)number + 0x10) - (long)local_78);
      item_local._4_4_ = 1;
    }
  }
  return item_local._4_4_;
}

Assistant:

static cJSON_bool parse_number(cJSON * const item, parse_buffer * const input_buffer)
{
    double number = 0;
    unsigned char *after_end = NULL;
    unsigned char number_c_string[64];
    unsigned char decimal_point = get_decimal_point();
    size_t i = 0;

    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false;
    }

    /* copy the number into a temporary buffer and replace '.' with the decimal point
     * of the current locale (for strtod)
     * This also takes care of '\0' not necessarily being available for marking the end of the input */
    for (i = 0; (i < (sizeof(number_c_string) - 1)) && can_access_at_index(input_buffer, i); i++)
    {
        switch (buffer_at_offset(input_buffer)[i])
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '+':
            case '-':
            case 'e':
            case 'E':
                number_c_string[i] = buffer_at_offset(input_buffer)[i];
                break;

            case '.':
                number_c_string[i] = decimal_point;
                break;

            default:
                goto loop_end;
        }
    }
loop_end:
    number_c_string[i] = '\0';

    number = strtod((const char*)number_c_string, (char**)&after_end);
    if (number_c_string == after_end)
    {
        return false; /* parse_error */
    }

    item->valuedouble = number;

    /* use saturation in case of overflow */
    if (number >= INT_MAX)
    {
        item->valueint = INT_MAX;
    }
    else if (number <= (double)INT_MIN)
    {
        item->valueint = INT_MIN;
    }
    else
    {
        item->valueint = (int)number;
    }

    item->type = cJSON_Number;

    input_buffer->offset += (size_t)(after_end - number_c_string);
    return true;
}